

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall CTcMake::add_include_path(CTcMake *this,textchar_t *path)

{
  CTcMakePath *this_00;
  CTcMakePath *pCVar1;
  long in_RDI;
  CTcMakePath *inc;
  textchar_t *in_stack_ffffffffffffffd8;
  CTcMakePath *in_stack_ffffffffffffffe0;
  
  this_00 = (CTcMakePath *)operator_new(0x10);
  CTcMakePath::CTcMakePath(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (*(long *)(in_RDI + 0x68) == 0) {
    CTcMakePath::set_next(this_00,*(CTcMakePath **)(in_RDI + 0x58));
    *(CTcMakePath **)(in_RDI + 0x58) = this_00;
  }
  else {
    pCVar1 = CTcMakePath::get_next(*(CTcMakePath **)(in_RDI + 0x68));
    CTcMakePath::set_next(this_00,pCVar1);
    CTcMakePath::set_next(*(CTcMakePath **)(in_RDI + 0x68),this_00);
  }
  *(CTcMakePath **)(in_RDI + 0x68) = this_00;
  pCVar1 = CTcMakePath::get_next(this_00);
  if (pCVar1 == (CTcMakePath *)0x0) {
    *(CTcMakePath **)(in_RDI + 0x60) = this_00;
  }
  return;
}

Assistant:

void CTcMake::add_include_path(const textchar_t *path)
{
    CTcMakePath *inc;
    
    /* create the entry */
    inc = new CTcMakePath(path);
    
    /* 
     *   add it at the end of our non-system list - note that system files
     *   might follow this point, so we need to insert the item into the
     *   list after the last existing non-system item 
     */
    if (nonsys_inc_tail_ == 0)
    {
        /* no non-system path yet - insert at the head of the list */
        inc->set_next(inc_head_);
        inc_head_ = inc;
    }
    else
    {
        /* insert after the last non-system item */
        inc->set_next(nonsys_inc_tail_->get_next());
        nonsys_inc_tail_->set_next(inc);
    }

    /* this is the last non-system item */
    nonsys_inc_tail_ = inc;

    /* if this is the last item overall, advance the list tail */
    if (inc->get_next() == 0)
        inc_tail_ = inc;
}